

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__kinematics_model
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *pPVar1;
  bool bVar2;
  kinematics_model__AttributeData *pkVar3;
  StringHash SVar4;
  long *in_RSI;
  void **in_RDI;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  kinematics_model__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  undefined8 *local_38;
  bool local_1;
  
  pkVar3 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL15::kinematics_model__AttributeData>
                     (in_stack_ffffffffffffffb0,in_RDI);
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_00a0d788:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          if ((ParserChar *)*local_38 == (ParserChar *)0x0) goto LAB_00a0d788;
          SVar4 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)*local_38);
          if (local_38 + 1 == (undefined8 *)0x0) {
            return false;
          }
          pPVar1 = (ParserChar *)local_38[1];
          local_38 = local_38 + 2;
          if (SVar4 != 0x6f4) break;
          pkVar3->id = pPVar1;
        }
        if (SVar4 != 0x74835) break;
        pkVar3->name = pPVar1;
      }
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar2);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__kinematics_model( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__kinematics_model( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

kinematics_model__AttributeData* attributeData = newData<kinematics_model__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_KINEMATICS_MODEL, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}